

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * fmt::v5::internal::
          format_decimal<unsigned_long,wchar_t,fmt::v5::internal::add_thousands_sep<wchar_t>>
                    (wchar_t *buffer,unsigned_long value,int num_digits,
                    add_thousands_sep<wchar_t> thousands_sep)

{
  long lVar1;
  uint index;
  uint index_1;
  wchar_t *end;
  unsigned_long uStack_20;
  int num_digits_local;
  unsigned_long value_local;
  wchar_t *buffer_local;
  
  if (num_digits < 0) {
    value_local = (unsigned_long)buffer;
    __assert_fail("(num_digits >= 0) && \"invalid digit count\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                  ,0x3c0,
                  "Char *fmt::internal::format_decimal(Char *, UInt, int, ThousandsSep) [UInt = unsigned long, Char = wchar_t, ThousandsSep = fmt::internal::add_thousands_sep<wchar_t>]"
                 );
  }
  uStack_20 = value;
  value_local = (unsigned_long)(buffer + num_digits);
  while (99 < uStack_20) {
    lVar1 = (uStack_20 % 100) * 2;
    uStack_20 = uStack_20 / 100;
    *(int *)(value_local - 4) = (int)(char)basic_data<void>::DIGITS[(int)lVar1 + 1];
    value_local = value_local - 4;
    add_thousands_sep<wchar_t>::operator()(&thousands_sep,(wchar_t **)&value_local);
    *(int *)(value_local - 4) = (int)(char)basic_data<void>::DIGITS[lVar1];
    value_local = value_local - 4;
    add_thousands_sep<wchar_t>::operator()(&thousands_sep,(wchar_t **)&value_local);
  }
  if (uStack_20 < 10) {
    *(int *)(value_local - 4) = (int)uStack_20 + 0x30;
  }
  else {
    *(int *)(value_local - 4) = (int)(char)basic_data<void>::DIGITS[(int)(uStack_20 << 1) + 1];
    value_local = value_local - 4;
    add_thousands_sep<wchar_t>::operator()(&thousands_sep,(wchar_t **)&value_local);
    *(int *)(value_local - 4) = (int)(char)basic_data<void>::DIGITS[uStack_20 << 1 & 0xffffffff];
  }
  return buffer + num_digits;
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, int num_digits,
                            ThousandsSep thousands_sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
    thousands_sep(buffer);
    *--buffer = static_cast<Char>(data::DIGITS[index]);
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<Char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
  thousands_sep(buffer);
  *--buffer = static_cast<Char>(data::DIGITS[index]);
  return end;
}